

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.c
# Opt level: O3

uint MCRegisterInfo_getSubReg(MCRegisterInfo *RI,uint Reg,uint Idx)

{
  ushort uVar1;
  MCPhysReg *pMVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  
  pMVar2 = RI->DiffLists;
  if (pMVar2 != (MCPhysReg *)0x0) {
    uVar5 = (ulong)RI->Desc[Reg].SubRegs;
    if (pMVar2[uVar5] != 0) {
      uVar3 = pMVar2[uVar5] + Reg;
      lVar4 = 0;
      do {
        if (*(ushort *)((long)RI->SubRegIndices + lVar4 + (ulong)RI->Desc[Reg].SubRegIndices * 2) ==
            Idx) {
          return uVar3 & 0xffff;
        }
        uVar1 = *(ushort *)((long)pMVar2 + lVar4 + uVar5 * 2 + 2);
        uVar3 = uVar3 + uVar1;
        lVar4 = lVar4 + 2;
      } while (uVar1 != 0);
    }
  }
  return 0;
}

Assistant:

unsigned MCRegisterInfo_getSubReg(MCRegisterInfo *RI, unsigned Reg, unsigned Idx)
{
	DiffListIterator iter;
	uint16_t *SRI = RI->SubRegIndices + RI->Desc[Reg].SubRegIndices;

	DiffListIterator_init(&iter, (MCPhysReg)Reg, RI->DiffLists + RI->Desc[Reg].SubRegs);
	DiffListIterator_next(&iter);

	while(DiffListIterator_isValid(&iter)) {
		if (*SRI == Idx)
			return DiffListIterator_getVal(&iter);
		DiffListIterator_next(&iter);
		++SRI;
	}

	return 0;
}